

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  EncodedChar *location;
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  undefined4 *puVar4;
  codepoint_t cVar5;
  codepoint_t codePointValue;
  codepoint_t codePoint;
  codepoint_t codePointValue_00;
  EncodedChar **p;
  EncodedChar **ppEVar6;
  EncodedChar EVar7;
  char16 local_48;
  OLECHAR local_46;
  char16 local_44;
  char16 local_42;
  char16 ignore;
  Char outChar;
  char16 leftSingleChar;
  char16 rightSingleChar;
  codepoint_t local_38;
  bool local_31 [8];
  bool previousSurrogatePart;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00edc289;
    *puVar4 = 0;
  }
  _ignore = &this->next;
  if (**_ignore == '^') {
    if (this->inputLim < *_ignore + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00edc289;
      *puVar4 = 0;
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)**_ignore < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar2) goto LAB_00edc289;
      *puVar4 = 0;
    }
    *_ignore = *_ignore + 1;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00edc289;
    *puVar4 = 0;
  }
  ppEVar6 = _ignore;
  EVar7 = **_ignore;
  local_31[0] = false;
  if (EVar7 != ']') {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_38 = 0xffffffff;
    codePointValue = 0xffffffff;
    codePoint = 0xffffffff;
    do {
      p = _ignore;
      location = *ppEVar6;
      if (EVar7 == '\\') {
        if (this->inputLim <= location) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar2) goto LAB_00edc289;
          *puVar4 = 0;
        }
        local_46 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                             (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
        bVar2 = ClassEscapePass0(this,&local_46,local_31);
        codePoint = (codepoint_t)(ushort)local_46;
        cVar5 = codePointValue;
        if (local_38 == 0xffffffff) {
          cVar5 = 0xffffffff;
        }
        if (!bVar2) {
          codePoint = 0xffffffff;
          codePointValue = cVar5;
        }
      }
      else if (EVar7 == '-') {
        if ((codePointValue == 0xffffffff) && (codePoint != 0xffffffff)) {
          codePointValue = codePoint;
          if (location == this->positionAfterLastSurrogate) {
            codePointValue = this->valueOfLastSurrogate;
          }
          if (this->inputLim <= location) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar2) goto LAB_00edc289;
            *puVar4 = 0;
          }
          UTF8EncodingPolicyBase<false>::ReadFull<true>
                    (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
          codePoint = 0xffffffff;
        }
        else {
          if (this->inputLim <= location) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar2) goto LAB_00edc289;
            *puVar4 = 0;
          }
          OVar3 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                            (&this->super_UTF8EncodingPolicyBase<false>,p,this->inputLim);
          codePoint = (codepoint_t)(ushort)OVar3;
        }
        this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
        p = _ignore;
        if (local_31[0] == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x7d6,"(!previousSurrogatePart)","!previousSurrogatePart");
          if (!bVar2) goto LAB_00edc289;
          *puVar4 = 0;
          p = _ignore;
        }
      }
      else {
        if ((EVar7 == '\0') && (this->inputLim <= location)) {
          Fail(this,-0x7ff5ec65);
          return;
        }
        if (this->inputLim <= location) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar2) goto LAB_00edc289;
          *puVar4 = 0;
        }
        OVar3 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                          (&this->super_UTF8EncodingPolicyBase<false>,_ignore,this->inputLim);
        codePoint = (codepoint_t)(ushort)OVar3;
        p = _ignore;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          TrackIfSurrogatePair(this,codePoint,location,*(int *)&this->next - (int)location);
          p = _ignore;
        }
      }
      ppEVar6 = p;
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
        cVar5 = local_38;
        if ((codePointValue != 0xffffffff) && (codePoint != 0xffffffff)) {
          if (0xffff < codePointValue) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7e7,"(pendingRangeStart < 0x10000)","pendingRangeStart < 0x10000")
            ;
            if (!bVar2) goto LAB_00edc289;
            *puVar4 = 0;
          }
          if (local_38 != 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7e8,"(pendingRangeEnd == INVALID_CODEPOINT)",
                               "pendingRangeEnd == INVALID_CODEPOINT");
            if (!bVar2) goto LAB_00edc289;
            *puVar4 = 0;
          }
          if (codePoint < codePointValue) {
            Fail(this,-0x7ff5ec63);
          }
          codePoint = 0xffffffff;
          goto LAB_00edc09e;
        }
      }
      else if (codePointValue == 0xffffffff) {
LAB_00edc09e:
        codePointValue = 0xffffffff;
        cVar5 = local_38;
      }
      else if ((codePoint & local_38) == 0xffffffff) {
        codePoint = 0xffffffff;
        local_38 = 0xffffffff;
        cVar5 = local_38;
      }
      else {
        if (this->next == this->positionAfterLastSurrogate) {
          codePointValue_00 = this->valueOfLastSurrogate;
          codePoint = 0xffffffff;
          if (local_31[0] == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7f8,"(!previousSurrogatePart)","!previousSurrogatePart");
            if (!bVar2) goto LAB_00edc289;
            *puVar4 = 0;
          }
        }
        else {
          if (this->inputLim < this->next) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar2) goto LAB_00edc289;
            *puVar4 = 0;
          }
          codePointValue_00 = local_38;
          if (local_38 == 0xffffffff) {
            codePointValue_00 = codePoint;
          }
          if (**p != ']') {
            codePointValue_00 = local_38;
          }
        }
        ppEVar6 = _ignore;
        cVar5 = codePoint;
        if (codePointValue_00 != 0xffffffff) {
          if (codePointValue < 0x10000) {
            local_44 = (char16)codePointValue;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue,&local_48,&local_44);
          }
          if (codePointValue_00 < 0x10000) {
            local_42 = (char16)codePointValue_00;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue_00,&local_42,&local_48);
          }
          if ((codePointValue_00 < codePointValue) &&
             ((codePointValue_00 | codePointValue) < 0x10000)) {
            Fail(this,-0x7ff5ec63);
          }
          else {
            if ((ushort)local_42 < (ushort)local_44) {
              DeferredFailIfNotUnicode(this,-0x7ff5ec63);
            }
            if (codePointValue_00 < codePointValue) {
              DeferredFailIfUnicode(this,-0x7ff5ec63);
            }
          }
          codePointValue = 0xffffffff;
          local_38 = 0xffffffff;
          ppEVar6 = _ignore;
          cVar5 = local_38;
        }
      }
      local_38 = cVar5;
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00edc289;
        *puVar4 = 0;
      }
      EVar7 = **ppEVar6;
    } while (EVar7 != ']');
    if (local_38 != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x83a,"(pendingRangeEnd == INVALID_CODEPOINT)",
                         "pendingRangeEnd == INVALID_CODEPOINT");
      if (!bVar2) {
LAB_00edc289:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::CharacterClassPass0()
    {
        // Could be terminating 0
        if (ECLookahead() == '^')
            ECConsume();

        EncodedChar nextChar = ECLookahead();
        const EncodedChar* current;
        codepoint_t lastCodepoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        codepoint_t pendingRangeEnd = INVALID_CODEPOINT;
        bool previousSurrogatePart = false;

        while(nextChar != ']')
        {
            current = next;

            if (nextChar == '\0' && IsEOF())
            {
                // Report as unclosed '['
                Fail(JSERR_RegExpNoBracket);
                return;
            } // Otherwise embedded '\0' is ok
            else if (nextChar == '\\')
            {
                // Consume, as classescapepass0 expects for it to be consumed
                Char outChar = NextChar();
                // If previousSurrogatePart = true upon leaving this method, then we are going to pass through here twice
                // This is because \u{} escape sequence was encountered that is actually 2 characters, the second time we will pass consuming entire character
                if (ClassEscapePass0(outChar, previousSurrogatePart))
                {
                    lastCodepoint = outChar;
                }
                else
                {
                    // Last codepoint isn't a singleton, so no codepoint tracking for the sake of ranges is needed.
                    lastCodepoint = INVALID_CODEPOINT;
                    // Unless we have a possible range end, cancel our range tracking.
                    if (pendingRangeEnd == INVALID_CODEPOINT)
                    {
                        pendingRangeStart = INVALID_CODEPOINT;
                    }
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || lastCodepoint == INVALID_CODEPOINT)
                {
                    // '-' is the upper part of the range, with pendingRangeStart codepoint is the lower. Set  lastCodePoint to '-' to check at the end of the while statement
                    // OR
                    // '-' is just a char, consume it and set as last char
                    lastCodepoint = NextChar();
                }
                else
                {
                    pendingRangeStart = this->next == this->positionAfterLastSurrogate
                        ? this->valueOfLastSurrogate
                        : lastCodepoint;
                    lastCodepoint = INVALID_CODEPOINT;
                    NextChar();
                }

                // If we have a pattern of the form [\ud800-\udfff], we need this to be interpreted as a range.
                // In order to achieve this, the two variables that we use to track surrogate pairs, namely
                // tempLocationOfSurrogatePair and previousSurrogatePart, need to be in a certain state.
                //
                // We need to reset tempLocationOfSurrogatePair as it points to the first Unicode escape (\ud800)
                // when we're here. We need to clear it in order not to have a surrogate pair when we process the
                // second escape (\udfff).
                //
                // previousSurrogatePart is used when we have a code point in the \u{...} extended format and the
                // character is in a supplementary plane. However, there is no need to change its value here. When
                // such an escape sequence is encountered, the first call to ClassEscapePass0() sets the variable
                // to true, but it rewinds the input back to the beginning of the escape sequence. The next
                // iteration of the loop here will again call ClassEscape0() with the same character and the
                // variable will this time be set to false. Therefore, the variable will always be false here.
                tempLocationOfSurrogatePair = nullptr;
                Assert(!previousSurrogatePart);
            }
            else
            {
                lastCodepoint = NextChar();

                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(lastCodepoint, current, (uint32)(next - current));
                }
            }

            if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
            {
                // This is much easier to handle.
                if (pendingRangeStart != INVALID_CODEPOINT && lastCodepoint != INVALID_CODEPOINT)
                {
                    Assert(pendingRangeStart < 0x10000);
                    Assert(pendingRangeEnd == INVALID_CODEPOINT);
                    if (pendingRangeStart > lastCodepoint)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    pendingRangeStart = lastCodepoint = INVALID_CODEPOINT;
                }
            }
            // We have a candidate for range end, and we have a range start.
            else if (pendingRangeStart != INVALID_CODEPOINT && (lastCodepoint != INVALID_CODEPOINT || pendingRangeEnd != INVALID_CODEPOINT))
            {
                // The following will be true at the end of each surrogate pair parse.
                // Note, the escape sequence \u{} is a two time parse, so this will be true on the second time around.
                if (this->next == this->positionAfterLastSurrogate)
                {
                    lastCodepoint = this->valueOfLastSurrogate;
                    Assert(!previousSurrogatePart);
                    pendingRangeEnd = lastCodepoint;

                    lastCodepoint = INVALID_CODEPOINT;
                }
                // If the next character is the end of range ']', then we can't have a surrogate pair.
                // The current character is the range end, if we don't already have a candidate.
                else if (ECLookahead() == ']' && pendingRangeEnd == INVALID_CODEPOINT)
                {
                    pendingRangeEnd = lastCodepoint;
                }

                //If we get here, and pendingRangeEnd is set. Then one of the above has caused it to be set, or the previous iteration of the loop.
                if (pendingRangeEnd != INVALID_CODEPOINT)
                {
                    char16 leftSingleChar, rightSingleChar, ignore;

                    if (pendingRangeStart >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeStart, &ignore, &leftSingleChar);
                    }
                    else
                    {
                        leftSingleChar = (char16)pendingRangeStart;
                    }

                    if (pendingRangeEnd >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeEnd, &rightSingleChar, &ignore);
                    }
                    else
                    {
                        rightSingleChar = (char16)pendingRangeEnd;
                    }

                    // Here it is a bit tricky, we don't know if we have a unicode option specified.
                    // If it is, then \ud800\udc00 - \ud800\udc01 is valid, otherwise invalid.
                    if (pendingRangeStart < 0x10000 && pendingRangeEnd < 0x10000 && pendingRangeStart > pendingRangeEnd)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    else
                    {
                        if(leftSingleChar > rightSingleChar)
                        {
                            DeferredFailIfNotUnicode(JSERR_RegExpBadRange);
                        }

                        if (pendingRangeStart > pendingRangeEnd)
                        {
                            DeferredFailIfUnicode(JSERR_RegExpBadRange);
                        }
                    }

                    pendingRangeStart = pendingRangeEnd = INVALID_CODEPOINT;
                }
                // The current char < 0x10000 is a candidate for the range end, but we need to iterate one more time.
                else
                {
                    pendingRangeEnd = lastCodepoint;
                }
            }
            nextChar = ECLookahead();
        }

        // We should never have a pendingRangeEnd set when we exit the loop
        Assert(pendingRangeEnd == INVALID_CODEPOINT);
    }